

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int fts5ExprNodeTest_AND(Fts5Expr *pExpr,Fts5ExprNode *pAnd)

{
  Fts5ExprNode *pFVar1;
  bool bVar2;
  int iVar3;
  ulong uVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  
  lVar5 = pAnd->iRowid;
  uVar4 = (ulong)(uint)pAnd->nChild;
  do {
    pAnd->bNomatch = 0;
    if ((int)uVar4 < 1) goto LAB_001e227e;
    bVar2 = true;
    lVar6 = 0;
    lVar7 = lVar5;
    do {
      pFVar1 = pAnd->apChild[lVar6];
      if (pExpr->bDesc == 0) {
        if (pFVar1->iRowid < lVar7) goto LAB_001e2200;
      }
      else if (lVar7 < pFVar1->iRowid) {
LAB_001e2200:
        iVar3 = (*pFVar1->xNext)(pExpr,pFVar1,1,lVar7);
        if (iVar3 != 0) {
          pAnd->bNomatch = 0;
          return iVar3;
        }
      }
      if (pFVar1->bEof != 0) {
        fts5ExprSetEof(pAnd);
        lVar5 = lVar7;
        goto LAB_001e226a;
      }
      lVar5 = pFVar1->iRowid;
      if (lVar7 != lVar5) {
        bVar2 = false;
      }
      if (pFVar1->bNomatch != 0) {
        pAnd->bNomatch = 1;
      }
      lVar6 = lVar6 + 1;
      uVar4 = (ulong)pAnd->nChild;
      lVar7 = lVar5;
    } while (lVar6 < (long)uVar4);
  } while (!bVar2);
LAB_001e226a:
  if ((pAnd->bNomatch != 0) && (pExpr->pRoot != pAnd)) {
    fts5ExprNodeZeroPoslist(pAnd);
  }
LAB_001e227e:
  pAnd->iRowid = lVar5;
  return 0;
}

Assistant:

static int fts5ExprNodeTest_AND(
  Fts5Expr *pExpr,                /* Expression pPhrase belongs to */
  Fts5ExprNode *pAnd              /* FTS5_AND node to advance */
){
  int iChild;
  i64 iLast = pAnd->iRowid;
  int rc = SQLITE_OK;
  int bMatch;

  assert( pAnd->bEof==0 );
  do {
    pAnd->bNomatch = 0;
    bMatch = 1;
    for(iChild=0; iChild<pAnd->nChild; iChild++){
      Fts5ExprNode *pChild = pAnd->apChild[iChild];
      int cmp = fts5RowidCmp(pExpr, iLast, pChild->iRowid);
      if( cmp>0 ){
        /* Advance pChild until it points to iLast or laster */
        rc = fts5ExprNodeNext(pExpr, pChild, 1, iLast);
        if( rc!=SQLITE_OK ){
          pAnd->bNomatch = 0;
          return rc;
        }
      }

      /* If the child node is now at EOF, so is the parent AND node. Otherwise,
      ** the child node is guaranteed to have advanced at least as far as
      ** rowid iLast. So if it is not at exactly iLast, pChild->iRowid is the
      ** new lastest rowid seen so far.  */
      assert( pChild->bEof || fts5RowidCmp(pExpr, iLast, pChild->iRowid)<=0 );
      if( pChild->bEof ){
        fts5ExprSetEof(pAnd);
        bMatch = 1;
        break;
      }else if( iLast!=pChild->iRowid ){
        bMatch = 0;
        iLast = pChild->iRowid;
      }

      if( pChild->bNomatch ){
        pAnd->bNomatch = 1;
      }
    }
  }while( bMatch==0 );

  if( pAnd->bNomatch && pAnd!=pExpr->pRoot ){
    fts5ExprNodeZeroPoslist(pAnd);
  }
  pAnd->iRowid = iLast;
  return SQLITE_OK;
}